

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmGeneratorTarget *pcVar4;
  cmLocalUnixMakefileGenerator3 *pcVar5;
  cmMakefile *pcVar6;
  pointer pcVar7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  long *plVar11;
  size_type *psVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string targetOutput;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string buildEcho;
  EchoProgress local_138;
  string local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_type local_48;
  pointer local_40;
  string *local_38;
  
  pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_138.Dir,&this->super_cmMakefileTargetGenerator);
  bVar8 = requireDeviceLinking(pcVar4,(cmLocalGenerator *)pcVar5,&local_138.Dir);
  paVar2 = &local_138.Dir.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.Dir._M_dataplus._M_p != paVar2) {
    operator_delete(local_138.Dir._M_dataplus._M_p,
                    CONCAT71(local_138.Dir.field_2._M_allocated_capacity._1_7_,
                             local_138.Dir.field_2._M_local_buf[0]) + 1);
  }
  if (bVar8) {
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar6 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_138.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"CMAKE_CUDA_OUTPUT_EXTENSION","");
    psVar10 = cmMakefile::GetSafeDefinition(pcVar6,&local_138.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_138.Dir._M_dataplus._M_p,
                      CONCAT71(local_138.Dir.field_2._M_allocated_capacity._1_7_,
                               local_138.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar7 = (pcVar4->ObjectDirectory)._M_dataplus._M_p;
    local_138.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar7,pcVar7 + (pcVar4->ObjectDirectory)._M_string_length);
    std::__cxx11::string::append((char *)&local_138);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_138,(ulong)(psVar10->_M_dataplus)._M_p);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8.field_2._8_8_ = plVar11[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_138.Dir._M_dataplus._M_p,
                      CONCAT71(local_138.Dir.field_2._M_allocated_capacity._1_7_,
                               local_138.Dir.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
    puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
    *puVar1 = *puVar1 + 1;
    if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
      paVar3 = &local_138.Arg.field_2;
      local_138.Dir._M_string_length = 0;
      local_138.Dir.field_2._M_local_buf[0] = '\0';
      local_138.Arg._M_string_length = 0;
      local_138.Arg.field_2._M_local_buf[0] = '\0';
      local_138.Dir._M_dataplus._M_p = (pointer)paVar2;
      local_138.Arg._M_dataplus._M_p = (pointer)paVar3;
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,&local_138)
      ;
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_c0,(cmOutputConverter *)pcVar5,&this->DeviceLinkObject);
      source._M_str = local_c0._M_dataplus._M_p;
      source._M_len = local_c0._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_a0,(cmOutputConverter *)pcVar5,source,SHELL,false);
      local_60.first._M_len = 0x19;
      local_60.first._M_str = "Linking CUDA device code ";
      local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48 = local_a0._M_string_length;
      local_40 = local_a0._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = &local_60;
      local_38 = &local_a0;
      cmCatViews(&local_80,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,&local_d8,&local_80,EchoLink
                 ,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.Arg._M_dataplus._M_p != paVar3) {
        operator_delete(local_138.Arg._M_dataplus._M_p,
                        CONCAT71(local_138.Arg.field_2._M_allocated_capacity._1_7_,
                                 local_138.Arg.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.Dir._M_dataplus._M_p != paVar2) {
        operator_delete(local_138.Dir._M_dataplus._M_p,
                        CONCAT71(local_138.Dir.field_2._M_allocated_capacity._1_7_,
                                 local_138.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    pcVar6 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_138.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"CMAKE_CUDA_COMPILER_ID","");
    psVar10 = cmMakefile::GetSafeDefinition(pcVar6,&local_138.Dir);
    iVar9 = std::__cxx11::string::compare((char *)psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_138.Dir._M_dataplus._M_p,
                      CONCAT71(local_138.Dir.field_2._M_allocated_capacity._1_7_,
                               local_138.Dir.field_2._M_local_buf[0]) + 1);
    }
    if (iVar9 == 0) {
      cmMakefileTargetGenerator::WriteDeviceLinkRule
                (&this->super_cmMakefileTargetGenerator,&local_d8,&local_f8);
    }
    else {
      (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
        _vptr_cmCommonTargetGenerator[9])(this,(ulong)relink,&local_d8,&local_f8);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,&local_f8,relink);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifndef CMAKE_BOOTSTRAP
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (!requiresDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the name of the device object to generate.
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");
  std::string const targetOutput =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutput;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = cmStrCat(
      "Linking CUDA device code ",
      this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToCurBinDir(this->DeviceLinkObject),
        cmOutputConverter::SHELL));
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  if (this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID") == "Clang") {
    this->WriteDeviceLinkRule(commands, targetOutput);
  } else {
    this->WriteNvidiaDeviceExecutableRule(relink, commands, targetOutput);
  }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutput, relink);
#else
  static_cast<void>(relink);
#endif
}